

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O0

void __thiscall
bdNodeManager::ConnectionAuth
          (bdNodeManager *this,bdId *srcId,bdId *proxyId,bdId *destId,uint32_t mode,uint32_t loc,
          uint32_t bandwidth,uint32_t delay,uint32_t answer)

{
  uint32_t loc_local;
  uint32_t mode_local;
  bdId *destId_local;
  bdId *proxyId_local;
  bdId *srcId_local;
  bdNodeManager *this_local;
  
  std::operator<<((ostream *)&std::cerr,"bdNodeManager::ConnectionAuth()");
  std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  if (answer == 0) {
    bdConnectManager::AuthConnectionOk
              ((this->super_bdNode).mConnMgr,srcId,proxyId,destId,mode,loc,bandwidth,delay);
  }
  else {
    bdConnectManager::AuthConnectionNo
              ((this->super_bdNode).mConnMgr,srcId,proxyId,destId,mode,loc,answer);
  }
  return;
}

Assistant:

void bdNodeManager::ConnectionAuth(bdId *srcId, bdId *proxyId, bdId *destId, uint32_t mode, uint32_t loc, uint32_t bandwidth, uint32_t delay, uint32_t answer) {
	std::cerr << "bdNodeManager::ConnectionAuth()";
	std::cerr << std::endl;

	if (answer == BITDHT_CONNECT_ANSWER_OKAY)
		mConnMgr->AuthConnectionOk(srcId, proxyId, destId, mode, loc, bandwidth, delay);
	else
		mConnMgr->AuthConnectionNo(srcId, proxyId, destId, mode, loc, answer);
}